

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void INT_EVsubmit(EVsource source,void *data,attr_list attrs)

{
  _event_path_data *p_Var1;
  int iVar2;
  event_item *event;
  undefined8 uVar3;
  FMFormat p_Var4;
  attr_list p_Var5;
  EVFreeFunction p_Var6;
  CManager_conflict p_Var7;
  
  if (source->local_stone_id != -1) {
    p_Var1 = source->cm->evp;
    event = (event_item *)INT_CMmalloc(0x68);
    event->ref_count = 0;
    event->event_encoded = 0;
    *(undefined8 *)&event->contents = 0;
    event->encoded_event = (void *)0x0;
    event->event_len = 0;
    event->decoded_event = (void *)0x0;
    event->encoded_eventv = (FFSEncodeVector)0x0;
    event->reference_format = (FMFormat)0x0;
    event->ioBuffer = (FFSBuffer)0x0;
    event->format = (CMFormat)0x0;
    event->attrs = (attr_list)0x0;
    event->cm = (CManager_conflict)0x0;
    event->free_arg = (void *)0x0;
    event->free_func = (EVFreeFunction)0x0;
    event->ref_count = 1;
    event->event_len = -1;
    p_Var6 = source->free_func;
    event->contents = (uint)(p_Var6 != (EVFreeFunction)0x0);
    p_Var7 = source->cm;
    event->cm = p_Var7;
    if (source->preencoded == 0) {
      event->decoded_event = data;
      p_Var4 = source->reference_format;
      event->format = source->format;
    }
    else {
      event->event_encoded = 1;
      event->encoded_event = data;
      uVar3 = FFSTypeHandle_from_encode(p_Var1->ffsc,data);
      p_Var4 = (FMFormat)FMFormat_of_original(uVar3);
      p_Var7 = source->cm;
      p_Var6 = source->free_func;
    }
    event->reference_format = p_Var4;
    event->free_func = p_Var6;
    event->free_arg = source->free_data;
    p_Var5 = CMint_add_ref_attr_list
                       (p_Var7,attrs,
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                        ,0xd6f);
    event->attrs = p_Var5;
    internal_path_submit(source->cm,source->local_stone_id,event);
    do {
      p_Var7 = source->cm;
      iVar2 = process_local_actions(p_Var7);
    } while (iVar2 != 0);
    if ((event->ref_count != 1) && (event->contents == Event_App_Owned)) {
      p_Var7 = source->cm;
      event = reassign_memory_event(p_Var7,event,1);
    }
    return_event((event_path_data)p_Var7,event);
    return;
  }
  return;
}

Assistant:

void
INT_EVsubmit(EVsource source, void *data, attr_list attrs)
{
    event_path_data evp = source->cm->evp;
    event_item *event;
    if (source->local_stone_id == -1) return;  /* not connected */
    event = get_free_event(evp);
    if (source->free_func != NULL) {
	event->contents = Event_Freeable;
    } else {
	event->contents = Event_App_Owned;
    }
    event->cm = source->cm;
    if (source->preencoded) {
	event->event_encoded = 1;
	event->encoded_event = data;
	event->reference_format = FMFormat_of_original(FFSTypeHandle_from_encode(evp->ffsc, 
							    data));
    } else {
	event->event_encoded = 0;
	event->decoded_event = data;
	event->reference_format = source->reference_format;
	event->format = source->format;
    }
    event->free_func = source->free_func;
    event->free_arg = source->free_data;
    event->attrs = CMadd_ref_attr_list(source->cm, attrs);
    internal_path_submit(source->cm, source->local_stone_id, event);
    while (process_local_actions(source->cm));
    if (event->ref_count != 1 && (event->contents == Event_App_Owned)) {
	event = reassign_memory_event(source->cm, event, 1);  /* reassign memory */
    }
    return_event(source->cm->evp, event);
}